

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomWidget::read(DomWidget *this,int __fd,void *__buf,size_t __nbytes)

{
  QStringView other;
  QStringView other_00;
  QStringView other_01;
  QStringView other_02;
  QStringView other_03;
  QStringView other_04;
  QStringView other_05;
  QStringView other_06;
  QStringView other_07;
  QStringView other_08;
  QStringView other_09;
  QStringView other_10;
  QStringView other_11;
  QStringView other_12;
  bool bVar1;
  int iVar2;
  DomProperty *pDVar3;
  DomRow *this_00;
  DomColumn *this_01;
  DomItem *this_02;
  DomLayout *this_03;
  DomWidget *this_04;
  DomAction *this_05;
  size_t sVar4;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  undefined4 in_register_00000034;
  parameter_type pDVar5;
  long in_FS_OFFSET;
  DomActionRef *v_9;
  DomActionGroup *v_8;
  DomAction *v_7;
  DomWidget *v_6;
  DomLayout *v_5;
  DomItem *v_4;
  DomColumn *v_3;
  DomRow *v_2;
  DomProperty *v_1;
  DomProperty *v;
  QXmlStreamAttribute *attribute;
  QXmlStreamAttributes *__range1;
  QXmlStreamAttributes *attributes;
  QStringView tag;
  QStringView name;
  const_iterator __end1;
  const_iterator __begin1;
  parameter_type in_stack_fffffffffffffa28;
  DomProperty *in_stack_fffffffffffffa30;
  undefined7 in_stack_fffffffffffffa38;
  byte in_stack_fffffffffffffa3f;
  DomActionRef *in_stack_fffffffffffffa40;
  undefined7 in_stack_fffffffffffffa48;
  byte in_stack_fffffffffffffa4f;
  DomActionGroup *in_stack_fffffffffffffa50;
  undefined7 in_stack_fffffffffffffa58;
  byte in_stack_fffffffffffffa5f;
  undefined1 local_438 [424];
  char local_290 [72];
  char local_248 [112];
  undefined1 local_1d8 [64];
  undefined1 local_198 [16];
  QLatin1StringView local_188;
  QStringView local_120;
  QStringView local_e8;
  QStringView local_98;
  QStringView local_48;
  QXmlStreamAttribute *local_38;
  const_iterator local_30;
  const_iterator local_28 [4];
  long local_8;
  
  pDVar5 = (parameter_type)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  local_28[0].i = (QXmlStreamAttribute *)0xaaaaaaaaaaaaaaaa;
  local_28[0] = QList<QXmlStreamAttribute>::begin
                          ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffa30);
  local_30.i = (QXmlStreamAttribute *)0xaaaaaaaaaaaaaaaa;
  local_30 = QList<QXmlStreamAttribute>::end
                       ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffa30);
  while( true ) {
    local_38 = local_30.i;
    bVar1 = QList<QXmlStreamAttribute>::const_iterator::operator!=(local_28,local_30);
    if (!bVar1) break;
    QList<QXmlStreamAttribute>::const_iterator::operator*(local_28);
    local_48.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
    local_48.m_size = 0xaaaaaaaaaaaaaaaa;
    local_48 = QXmlStreamAttribute::name((QXmlStreamAttribute *)0x19c8bd);
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
               (size_t)in_stack_fffffffffffffa40);
    QStringView::QStringView<QString,_true>
              ((QStringView *)in_stack_fffffffffffffa40,
               (QString *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38));
    bVar1 = ::operator==((QStringView *)in_stack_fffffffffffffa30,
                         (QStringView *)in_stack_fffffffffffffa28);
    QString::~QString((QString *)0x19c924);
    if (bVar1) {
      local_98 = QXmlStreamAttribute::value((QXmlStreamAttribute *)0x19c93e);
      QStringView::toString((QStringView *)in_stack_fffffffffffffa30);
      setAttributeClass((DomWidget *)in_stack_fffffffffffffa30,
                        &in_stack_fffffffffffffa28->m_attr_name);
      QString::~QString((QString *)0x19c985);
    }
    else {
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
                 (size_t)in_stack_fffffffffffffa40);
      QStringView::QStringView<QString,_true>
                ((QStringView *)in_stack_fffffffffffffa40,
                 (QString *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38));
      bVar1 = ::operator==((QStringView *)in_stack_fffffffffffffa30,
                           (QStringView *)in_stack_fffffffffffffa28);
      QString::~QString((QString *)0x19c9e1);
      if (bVar1) {
        local_e8 = QXmlStreamAttribute::value((QXmlStreamAttribute *)0x19c9fb);
        QStringView::toString((QStringView *)in_stack_fffffffffffffa30);
        setAttributeName((DomWidget *)in_stack_fffffffffffffa30,
                         &in_stack_fffffffffffffa28->m_attr_name);
        QString::~QString((QString *)0x19ca42);
      }
      else {
        Qt::Literals::StringLiterals::operator____s
                  ((char16_t *)CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
                   (size_t)in_stack_fffffffffffffa40);
        QStringView::QStringView<QString,_true>
                  ((QStringView *)in_stack_fffffffffffffa40,
                   (QString *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38));
        bVar1 = ::operator==((QStringView *)in_stack_fffffffffffffa30,
                             (QStringView *)in_stack_fffffffffffffa28);
        QString::~QString((QString *)0x19ca9e);
        if (bVar1) {
          local_120 = QXmlStreamAttribute::value((QXmlStreamAttribute *)0x19cabb);
          Qt::Literals::StringLiterals::operator____s
                    ((char16_t *)CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
                     (size_t)in_stack_fffffffffffffa40);
          QStringView::QStringView<QString,_true>
                    ((QStringView *)in_stack_fffffffffffffa40,
                     (QString *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38));
          bVar1 = ::operator==((QStringView *)in_stack_fffffffffffffa30,
                               (QStringView *)in_stack_fffffffffffffa28);
          setAttributeNative(this,bVar1);
          QString::~QString((QString *)0x19cb2e);
        }
        else {
          local_188 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT17(in_stack_fffffffffffffa3f,
                                                  in_stack_fffffffffffffa38),
                                 (size_t)in_stack_fffffffffffffa30);
          ::operator+((QLatin1String *)in_stack_fffffffffffffa30,
                      (QStringView *)in_stack_fffffffffffffa28);
          ::QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<QLatin1String,_const_QStringView_&> *)in_stack_fffffffffffffa28
                    );
          QXmlStreamReader::raiseError((QString *)pDVar5);
          QString::~QString((QString *)0x19cbb8);
        }
      }
    }
    QList<QXmlStreamAttribute>::const_iterator::operator++(local_28);
  }
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError((QXmlStreamReader *)0x19cbd9);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_0019d898;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      local_198._0_8_ = 0xaaaaaaaaaaaaaaaa;
      local_198._8_8_ = 0xaaaaaaaaaaaaaaaa;
      local_198 = QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
                 (size_t)in_stack_fffffffffffffa40);
      QStringView::QStringView<QString,_true>
                ((QStringView *)in_stack_fffffffffffffa40,
                 (QString *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38));
      other.m_data._0_7_ = in_stack_fffffffffffffa58;
      other.m_size = (qsizetype)in_stack_fffffffffffffa50;
      other.m_data._7_1_ = in_stack_fffffffffffffa5f;
      iVar2 = QStringView::compare((QStringView *)in_stack_fffffffffffffa28,other,CaseInsensitive);
      QString::~QString((QString *)0x19ccba);
      if (iVar2 == 0) {
        QXmlStreamReader::readElementText(local_1d8,pDVar5,0);
        QList<QString>::append
                  ((QList<QString> *)in_stack_fffffffffffffa30,
                   &in_stack_fffffffffffffa28->m_attr_name);
        QString::~QString((QString *)0x19cd14);
      }
      else {
        Qt::Literals::StringLiterals::operator____s
                  ((char16_t *)CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
                   (size_t)in_stack_fffffffffffffa40);
        QStringView::QStringView<QString,_true>
                  ((QStringView *)in_stack_fffffffffffffa40,
                   (QString *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38));
        sVar4 = 0;
        other_00.m_data._0_7_ = in_stack_fffffffffffffa58;
        other_00.m_size = (qsizetype)in_stack_fffffffffffffa50;
        other_00.m_data._7_1_ = in_stack_fffffffffffffa5f;
        iVar2 = QStringView::compare
                          ((QStringView *)in_stack_fffffffffffffa28,other_00,CaseInsensitive);
        QString::~QString((QString *)0x19cd82);
        if (iVar2 == 0) {
          pDVar3 = (DomProperty *)operator_new(0x178);
          memset(pDVar3,0,0x178);
          DomProperty::DomProperty(in_stack_fffffffffffffa30);
          DomProperty::read(pDVar3,__fd,__buf_00,sVar4);
          QList<DomProperty_*>::append((QList<DomProperty_*> *)0x19cdfb,in_stack_fffffffffffffa28);
        }
        else {
          Qt::Literals::StringLiterals::operator____s
                    ((char16_t *)CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
                     (size_t)in_stack_fffffffffffffa40);
          QStringView::QStringView<QString,_true>
                    ((QStringView *)in_stack_fffffffffffffa40,
                     (QString *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38));
          other_01.m_data._0_7_ = in_stack_fffffffffffffa58;
          other_01.m_size = (qsizetype)in_stack_fffffffffffffa50;
          other_01.m_data._7_1_ = in_stack_fffffffffffffa5f;
          iVar2 = QStringView::compare
                            ((QStringView *)in_stack_fffffffffffffa28,other_01,CaseInsensitive);
          QString::~QString((QString *)0x19ce69);
          if (iVar2 == 0) {
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)in_stack_fffffffffffffa40,
                       (char *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
                       (int)((ulong)in_stack_fffffffffffffa30 >> 0x20),
                       (char *)in_stack_fffffffffffffa28);
            QMessageLogger::warning(local_248,"Omitting deprecated element <script>.");
            QXmlStreamReader::skipCurrentElement();
          }
          else {
            Qt::Literals::StringLiterals::operator____s
                      ((char16_t *)CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
                       (size_t)in_stack_fffffffffffffa40);
            QStringView::QStringView<QString,_true>
                      ((QStringView *)in_stack_fffffffffffffa40,
                       (QString *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38));
            other_02.m_data._0_7_ = in_stack_fffffffffffffa58;
            other_02.m_size = (qsizetype)in_stack_fffffffffffffa50;
            other_02.m_data._7_1_ = in_stack_fffffffffffffa5f;
            iVar2 = QStringView::compare
                              ((QStringView *)in_stack_fffffffffffffa28,other_02,CaseInsensitive);
            QString::~QString((QString *)0x19cf1d);
            if (iVar2 == 0) {
              QMessageLogger::QMessageLogger
                        ((QMessageLogger *)in_stack_fffffffffffffa40,
                         (char *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
                         (int)((ulong)in_stack_fffffffffffffa30 >> 0x20),
                         (char *)in_stack_fffffffffffffa28);
              QMessageLogger::warning(local_290,"Omitting deprecated element <widgetdata>.");
              QXmlStreamReader::skipCurrentElement();
            }
            else {
              Qt::Literals::StringLiterals::operator____s
                        ((char16_t *)CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
                         (size_t)in_stack_fffffffffffffa40);
              QStringView::QStringView<QString,_true>
                        ((QStringView *)in_stack_fffffffffffffa40,
                         (QString *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38));
              sVar4 = 0;
              other_03.m_data._0_7_ = in_stack_fffffffffffffa58;
              other_03.m_size = (qsizetype)in_stack_fffffffffffffa50;
              other_03.m_data._7_1_ = in_stack_fffffffffffffa5f;
              iVar2 = QStringView::compare
                                ((QStringView *)in_stack_fffffffffffffa28,other_03,CaseInsensitive);
              QString::~QString((QString *)0x19cfd1);
              if (iVar2 == 0) {
                pDVar3 = (DomProperty *)operator_new(0x178);
                memset(pDVar3,0,0x178);
                DomProperty::DomProperty(in_stack_fffffffffffffa30);
                DomProperty::read(pDVar3,__fd,__buf_01,sVar4);
                QList<DomProperty_*>::append
                          ((QList<DomProperty_*> *)0x19d04a,in_stack_fffffffffffffa28);
              }
              else {
                Qt::Literals::StringLiterals::operator____s
                          ((char16_t *)CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48)
                           ,(size_t)in_stack_fffffffffffffa40);
                QStringView::QStringView<QString,_true>
                          ((QStringView *)in_stack_fffffffffffffa40,
                           (QString *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38))
                ;
                sVar4 = 0;
                other_04.m_data._0_7_ = in_stack_fffffffffffffa58;
                other_04.m_size = (qsizetype)in_stack_fffffffffffffa50;
                other_04.m_data._7_1_ = in_stack_fffffffffffffa5f;
                iVar2 = QStringView::compare
                                  ((QStringView *)in_stack_fffffffffffffa28,other_04,CaseInsensitive
                                  );
                QString::~QString((QString *)0x19d0b8);
                if (iVar2 == 0) {
                  this_00 = (DomRow *)operator_new(0x20);
                  memset(this_00,0,0x20);
                  DomRow::DomRow((DomRow *)0x19d0f3);
                  DomRow::read(this_00,__fd,__buf_02,sVar4);
                  QList<DomRow_*>::append
                            ((QList<DomRow_*> *)0x19d134,(parameter_type)in_stack_fffffffffffffa28);
                }
                else {
                  Qt::Literals::StringLiterals::operator____s
                            ((char16_t *)
                             CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
                             (size_t)in_stack_fffffffffffffa40);
                  QStringView::QStringView<QString,_true>
                            ((QStringView *)in_stack_fffffffffffffa40,
                             (QString *)
                             CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38));
                  sVar4 = 0;
                  other_05.m_data._0_7_ = in_stack_fffffffffffffa58;
                  other_05.m_size = (qsizetype)in_stack_fffffffffffffa50;
                  other_05.m_data._7_1_ = in_stack_fffffffffffffa5f;
                  iVar2 = QStringView::compare
                                    ((QStringView *)in_stack_fffffffffffffa28,other_05,
                                     CaseInsensitive);
                  QString::~QString((QString *)0x19d1a2);
                  if (iVar2 == 0) {
                    this_01 = (DomColumn *)operator_new(0x20);
                    memset(this_01,0,0x20);
                    DomColumn::DomColumn((DomColumn *)0x19d1d7);
                    DomColumn::read(this_01,__fd,__buf_03,sVar4);
                    QList<DomColumn_*>::append
                              ((QList<DomColumn_*> *)0x19d215,
                               (parameter_type)in_stack_fffffffffffffa28);
                  }
                  else {
                    Qt::Literals::StringLiterals::operator____s
                              ((char16_t *)
                               CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
                               (size_t)in_stack_fffffffffffffa40);
                    QStringView::QStringView<QString,_true>
                              ((QStringView *)in_stack_fffffffffffffa40,
                               (QString *)
                               CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38));
                    sVar4 = 0;
                    other_06.m_data._0_7_ = in_stack_fffffffffffffa58;
                    other_06.m_size = (qsizetype)in_stack_fffffffffffffa50;
                    other_06.m_data._7_1_ = in_stack_fffffffffffffa5f;
                    iVar2 = QStringView::compare
                                      ((QStringView *)in_stack_fffffffffffffa28,other_06,
                                       CaseInsensitive);
                    QString::~QString((QString *)0x19d280);
                    if (iVar2 == 0) {
                      this_02 = (DomItem *)operator_new(0x48);
                      memset(this_02,0,0x48);
                      DomItem::DomItem((DomItem *)in_stack_fffffffffffffa30);
                      DomItem::read(this_02,__fd,__buf_04,sVar4);
                      QList<DomItem_*>::append
                                ((QList<DomItem_*> *)0x19d2f0,
                                 (parameter_type)in_stack_fffffffffffffa28);
                    }
                    else {
                      Qt::Literals::StringLiterals::operator____s
                                ((char16_t *)
                                 CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
                                 (size_t)in_stack_fffffffffffffa40);
                      QStringView::QStringView<QString,_true>
                                ((QStringView *)in_stack_fffffffffffffa40,
                                 (QString *)
                                 CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38));
                      sVar4 = 0;
                      other_07.m_data._0_7_ = in_stack_fffffffffffffa58;
                      other_07.m_size = (qsizetype)in_stack_fffffffffffffa50;
                      other_07.m_data._7_1_ = in_stack_fffffffffffffa5f;
                      iVar2 = QStringView::compare
                                        ((QStringView *)in_stack_fffffffffffffa28,other_07,
                                         CaseInsensitive);
                      QString::~QString((QString *)0x19d35b);
                      if (iVar2 == 0) {
                        this_03 = (DomLayout *)operator_new(0x128);
                        memset(this_03,0,0x128);
                        DomLayout::DomLayout((DomLayout *)in_stack_fffffffffffffa30);
                        DomLayout::read(this_03,__fd,__buf_05,sVar4);
                        QList<DomLayout_*>::append
                                  ((QList<DomLayout_*> *)0x19d3cb,
                                   (parameter_type)in_stack_fffffffffffffa28);
                      }
                      else {
                        Qt::Literals::StringLiterals::operator____s
                                  ((char16_t *)
                                   CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
                                   (size_t)in_stack_fffffffffffffa40);
                        QStringView::QStringView<QString,_true>
                                  ((QStringView *)in_stack_fffffffffffffa40,
                                   (QString *)
                                   CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38));
                        sVar4 = 0;
                        other_08.m_data._0_7_ = in_stack_fffffffffffffa58;
                        other_08.m_size = (qsizetype)in_stack_fffffffffffffa50;
                        other_08.m_data._7_1_ = in_stack_fffffffffffffa5f;
                        iVar2 = QStringView::compare
                                          ((QStringView *)in_stack_fffffffffffffa28,other_08,
                                           CaseInsensitive);
                        QString::~QString((QString *)0x19d436);
                        if (iVar2 == 0) {
                          this_04 = (DomWidget *)operator_new(0x160);
                          memset(this_04,0,0x160);
                          DomWidget((DomWidget *)in_stack_fffffffffffffa30);
                          read(this_04,__fd,__buf_06,sVar4);
                          QList<DomWidget_*>::append
                                    ((QList<DomWidget_*> *)0x19d4a6,
                                     (parameter_type)in_stack_fffffffffffffa28);
                        }
                        else {
                          Qt::Literals::StringLiterals::operator____s
                                    ((char16_t *)
                                     CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
                                     (size_t)in_stack_fffffffffffffa40);
                          QStringView::QStringView<QString,_true>
                                    ((QStringView *)in_stack_fffffffffffffa40,
                                     (QString *)
                                     CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38));
                          sVar4 = 0;
                          other_09.m_data._0_7_ = in_stack_fffffffffffffa58;
                          other_09.m_size = (qsizetype)in_stack_fffffffffffffa50;
                          other_09.m_data._7_1_ = in_stack_fffffffffffffa5f;
                          iVar2 = QStringView::compare
                                            ((QStringView *)in_stack_fffffffffffffa28,other_09,
                                             CaseInsensitive);
                          QString::~QString((QString *)0x19d511);
                          if (iVar2 == 0) {
                            this_05 = (DomAction *)operator_new(0x70);
                            memset(this_05,0,0x70);
                            DomAction::DomAction((DomAction *)in_stack_fffffffffffffa30);
                            DomAction::read(this_05,__fd,__buf_07,sVar4);
                            QList<DomAction_*>::append
                                      ((QList<DomAction_*> *)0x19d581,
                                       (parameter_type)in_stack_fffffffffffffa28);
                          }
                          else {
                            Qt::Literals::StringLiterals::operator____s
                                      ((char16_t *)
                                       CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48)
                                       ,(size_t)in_stack_fffffffffffffa40);
                            QStringView::QStringView<QString,_true>
                                      ((QStringView *)in_stack_fffffffffffffa40,
                                       (QString *)
                                       CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38)
                                      );
                            sVar4 = 0;
                            other_10.m_data._0_7_ = in_stack_fffffffffffffa58;
                            other_10.m_size = (qsizetype)in_stack_fffffffffffffa50;
                            other_10.m_data._7_1_ = in_stack_fffffffffffffa5f;
                            iVar2 = QStringView::compare
                                              ((QStringView *)in_stack_fffffffffffffa28,other_10,
                                               CaseInsensitive);
                            in_stack_fffffffffffffa5f = iVar2 != 0 ^ 0xff;
                            QString::~QString((QString *)0x19d5ec);
                            if ((in_stack_fffffffffffffa5f & 1) == 0) {
                              Qt::Literals::StringLiterals::operator____s
                                        ((char16_t *)
                                         CONCAT17(in_stack_fffffffffffffa4f,
                                                  in_stack_fffffffffffffa48),
                                         (size_t)in_stack_fffffffffffffa40);
                              QStringView::QStringView<QString,_true>
                                        ((QStringView *)in_stack_fffffffffffffa40,
                                         (QString *)
                                         CONCAT17(in_stack_fffffffffffffa3f,
                                                  in_stack_fffffffffffffa38));
                              sVar4 = 0;
                              other_11.m_data._0_7_ = in_stack_fffffffffffffa58;
                              other_11.m_size = (qsizetype)in_stack_fffffffffffffa50;
                              other_11.m_data._7_1_ = in_stack_fffffffffffffa5f;
                              iVar2 = QStringView::compare
                                                ((QStringView *)in_stack_fffffffffffffa28,other_11,
                                                 CaseInsensitive);
                              in_stack_fffffffffffffa4f = iVar2 != 0 ^ 0xff;
                              QString::~QString((QString *)0x19d6c7);
                              if ((in_stack_fffffffffffffa4f & 1) == 0) {
                                Qt::Literals::StringLiterals::operator____s
                                          ((char16_t *)
                                           CONCAT17(in_stack_fffffffffffffa4f,
                                                    in_stack_fffffffffffffa48),
                                           (size_t)in_stack_fffffffffffffa40);
                                QStringView::QStringView<QString,_true>
                                          ((QStringView *)in_stack_fffffffffffffa40,
                                           (QString *)
                                           CONCAT17(in_stack_fffffffffffffa3f,
                                                    in_stack_fffffffffffffa38));
                                other_12.m_data._0_7_ = in_stack_fffffffffffffa58;
                                other_12.m_size = (qsizetype)in_stack_fffffffffffffa50;
                                other_12.m_data._7_1_ = in_stack_fffffffffffffa5f;
                                iVar2 = QStringView::compare
                                                  ((QStringView *)in_stack_fffffffffffffa28,other_12
                                                   ,CaseInsensitive);
                                in_stack_fffffffffffffa3f = iVar2 != 0 ^ 0xff;
                                QString::~QString((QString *)0x19d7a2);
                                if ((in_stack_fffffffffffffa3f & 1) == 0) {
                                  in_stack_fffffffffffffa28 = pDVar5;
                                  Qt::Literals::StringLiterals::operator____L1
                                            ((char *)CONCAT17(in_stack_fffffffffffffa3f,
                                                              in_stack_fffffffffffffa38),
                                             (size_t)in_stack_fffffffffffffa30);
                                  ::operator+((QLatin1String *)in_stack_fffffffffffffa30,
                                              (QStringView *)in_stack_fffffffffffffa28);
                                  ::QStringBuilder::operator_cast_to_QString
                                            ((QStringBuilder<QLatin1String,_const_QStringView_&> *)
                                             in_stack_fffffffffffffa28);
                                  QXmlStreamReader::raiseError
                                            (&in_stack_fffffffffffffa28->m_attr_name);
                                  QString::~QString((QString *)0x19d877);
                                }
                                else {
                                  in_stack_fffffffffffffa30 = (DomProperty *)&this->m_zOrder;
                                  QXmlStreamReader::readElementText(local_438,pDVar5,0);
                                  QList<QString>::append
                                            ((QList<QString> *)in_stack_fffffffffffffa30,
                                             &in_stack_fffffffffffffa28->m_attr_name);
                                  QString::~QString((QString *)0x19d7f5);
                                }
                              }
                              else {
                                in_stack_fffffffffffffa40 = (DomActionRef *)operator_new(0x20);
                                memset(in_stack_fffffffffffffa40,0,0x20);
                                DomActionRef::DomActionRef
                                          ((DomActionRef *)in_stack_fffffffffffffa30);
                                DomActionRef::read(in_stack_fffffffffffffa40,__fd,__buf_09,sVar4);
                                QList<DomActionRef_*>::append
                                          ((QList<DomActionRef_*> *)0x19d737,
                                           (parameter_type)in_stack_fffffffffffffa28);
                              }
                            }
                            else {
                              in_stack_fffffffffffffa50 = (DomActionGroup *)operator_new(0x80);
                              memset(in_stack_fffffffffffffa50,0,0x80);
                              DomActionGroup::DomActionGroup
                                        ((DomActionGroup *)in_stack_fffffffffffffa30);
                              DomActionGroup::read(in_stack_fffffffffffffa50,__fd,__buf_08,sVar4);
                              QList<DomActionGroup_*>::append
                                        ((QList<DomActionGroup_*> *)0x19d65c,
                                         (parameter_type)in_stack_fffffffffffffa28);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  } while (iVar2 != 5);
LAB_0019d898:
  QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x19d8a5);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomWidget::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"class"_s) {
            setAttributeClass(attribute.value().toString());
            continue;
        }
        if (name == u"name"_s) {
            setAttributeName(attribute.value().toString());
            continue;
        }
        if (name == u"native"_s) {
            setAttributeNative(attribute.value() == u"true"_s);
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"class"_s, Qt::CaseInsensitive)) {
                m_class.append(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"property"_s, Qt::CaseInsensitive)) {
                auto *v = new DomProperty();
                v->read(reader);
                m_property.append(v);
                continue;
            }
            if (!tag.compare(u"script"_s, Qt::CaseInsensitive)) {
                qWarning("Omitting deprecated element <script>.");
                reader.skipCurrentElement();
                continue;
            }
            if (!tag.compare(u"widgetdata"_s, Qt::CaseInsensitive)) {
                qWarning("Omitting deprecated element <widgetdata>.");
                reader.skipCurrentElement();
                continue;
            }
            if (!tag.compare(u"attribute"_s, Qt::CaseInsensitive)) {
                auto *v = new DomProperty();
                v->read(reader);
                m_attribute.append(v);
                continue;
            }
            if (!tag.compare(u"row"_s, Qt::CaseInsensitive)) {
                auto *v = new DomRow();
                v->read(reader);
                m_row.append(v);
                continue;
            }
            if (!tag.compare(u"column"_s, Qt::CaseInsensitive)) {
                auto *v = new DomColumn();
                v->read(reader);
                m_column.append(v);
                continue;
            }
            if (!tag.compare(u"item"_s, Qt::CaseInsensitive)) {
                auto *v = new DomItem();
                v->read(reader);
                m_item.append(v);
                continue;
            }
            if (!tag.compare(u"layout"_s, Qt::CaseInsensitive)) {
                auto *v = new DomLayout();
                v->read(reader);
                m_layout.append(v);
                continue;
            }
            if (!tag.compare(u"widget"_s, Qt::CaseInsensitive)) {
                auto *v = new DomWidget();
                v->read(reader);
                m_widget.append(v);
                continue;
            }
            if (!tag.compare(u"action"_s, Qt::CaseInsensitive)) {
                auto *v = new DomAction();
                v->read(reader);
                m_action.append(v);
                continue;
            }
            if (!tag.compare(u"actiongroup"_s, Qt::CaseInsensitive)) {
                auto *v = new DomActionGroup();
                v->read(reader);
                m_actionGroup.append(v);
                continue;
            }
            if (!tag.compare(u"addaction"_s, Qt::CaseInsensitive)) {
                auto *v = new DomActionRef();
                v->read(reader);
                m_addAction.append(v);
                continue;
            }
            if (!tag.compare(u"zorder"_s, Qt::CaseInsensitive)) {
                m_zOrder.append(reader.readElementText());
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}